

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O3

void av1_reset_simple_motion_tree_partition(SIMPLE_MOTION_DATA_TREE *sms_tree,BLOCK_SIZE bsize)

{
  BLOCK_SIZE bsize_00;
  long lVar1;
  int idx;
  
  if (sms_tree == (SIMPLE_MOTION_DATA_TREE *)0x0) {
    return;
  }
  sms_tree->partitioning = '\0';
  if (bsize < BLOCK_8X8) {
    return;
  }
  bsize_00 = BLOCK_INVALID;
  switch(bsize) {
  case BLOCK_16X16:
    lVar1 = 2;
    break;
  case BLOCK_16X32:
  case BLOCK_32X16:
  case BLOCK_32X64:
  case BLOCK_64X32:
  case BLOCK_64X128:
  case BLOCK_128X64:
    goto switchD_001a6b3f_caseD_7;
  case BLOCK_32X32:
    lVar1 = 3;
    break;
  case BLOCK_64X64:
    lVar1 = 4;
    break;
  case BLOCK_128X128:
    lVar1 = 5;
    break;
  default:
    lVar1 = 1;
    if (bsize != BLOCK_8X8) goto switchD_001a6b3f_caseD_7;
  }
  bsize_00 = subsize_lookup[3][lVar1];
switchD_001a6b3f_caseD_7:
  lVar1 = 0;
  do {
    av1_reset_simple_motion_tree_partition(sms_tree->split[lVar1],bsize_00);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return;
}

Assistant:

void av1_reset_simple_motion_tree_partition(SIMPLE_MOTION_DATA_TREE *sms_tree,
                                            BLOCK_SIZE bsize) {
  if (sms_tree == NULL) return;
  sms_tree->partitioning = PARTITION_NONE;

  if (bsize >= BLOCK_8X8) {
    BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
    for (int idx = 0; idx < 4; ++idx)
      av1_reset_simple_motion_tree_partition(sms_tree->split[idx], subsize);
  }
}